

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbufstream.h
# Opt level: O0

ktx_error_code_e
StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::getsize
          (ktxStream *str,ktx_size_t *size)

{
  bool bVar1;
  ktx_error_code_e kVar2;
  ulong uVar3;
  streamoff sVar4;
  ostream *poVar5;
  ulong *in_RSI;
  ktxStream *in_RDI;
  streampos newpos;
  streampos oldpos;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *self;
  fpos<__mbstate_t> *__rhs;
  fpos<__mbstate_t> *__lhs;
  fpos local_38 [16];
  fpos local_28 [16];
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *local_18;
  ulong *local_10;
  
  local_10 = in_RSI;
  local_18 = parent(in_RDI);
  local_28 = (fpos  [16])std::streambuf::pubseekoff((long)local_18->_streambuf,_S_beg,_S_app);
  __rhs = (fpos<__mbstate_t> *)local_18->_streambuf;
  std::operator|(_S_in,_S_out);
  local_38 = (fpos  [16])std::streambuf::pubseekoff((long)__rhs,_S_beg,_S_ate);
  uVar3 = std::fpos::operator_cast_to_long(local_38);
  *local_10 = uVar3;
  __lhs = (fpos<__mbstate_t> *)local_18->_streambuf;
  sVar4 = std::fpos::operator_cast_to_long(local_28);
  std::streambuf::pubseekoff
            ((long)__lhs,(_Ios_Seekdir)sVar4,~(_S_ios_openmode_min|_S_ios_openmode_max));
  poVar5 = std::operator<<((ostream *)cnull,"\t  size: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_10);
  poVar5 = std::operator<<(poVar5,'B');
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator==(__lhs,__rhs);
  kVar2 = KTX_FILE_SEEK_ERROR;
  if (bVar1) {
    kVar2 = KTX_SUCCESS;
  }
  return kVar2;
}

Assistant:

static KTX_error_code getsize(ktxStream* str, ktx_size_t* size)
    {
        auto self = parent(str);
        const std::streampos oldpos = self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode);
        *size = ktx_size_t(self->_streambuf->pubseekoff(0, std::ios::end));
        const std::streampos newpos = self->_streambuf->pubseekoff(oldpos, std::ios::beg, self->_seek_mode);
        logstream << "\t  size: " << *size << 'B' << std::endl;
        return (oldpos == newpos) ? KTX_SUCCESS : KTX_FILE_SEEK_ERROR;
    }